

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QString>::append(QList<QString> *this,QList<QString> *other)

{
  bool bVar1;
  QArrayDataPointer<QString> *pQVar2;
  QArrayDataPointer<QString> *in_RSI;
  QArrayDataPointer<QString> *in_RDI;
  QArrayDataPointer<QString> *unaff_retaddr;
  QArrayDataPointer<QString> *in_stack_ffffffffffffffe0;
  GrowthPosition where;
  
  pQVar2 = in_RDI;
  bVar1 = isEmpty((QList<QString> *)0x119426);
  where = (GrowthPosition)((ulong)pQVar2 >> 0x20);
  if (!bVar1) {
    QArrayDataPointer<QString>::operator->(in_RSI);
    bVar1 = QArrayDataPointer<QString>::needsDetach(in_stack_ffffffffffffffe0);
    if (bVar1) {
      append((QList<QString> *)in_RSI,(QList<QString> *)in_RDI);
    }
    else {
      size((QList<QString> *)in_RSI);
      QArrayDataPointer<QString>::detachAndGrow
                (unaff_retaddr,where,(qsizetype)in_RSI,(QString **)in_RDI,in_stack_ffffffffffffffe0)
      ;
      QArrayDataPointer<QString>::operator->(in_RDI);
      QArrayDataPointer<QString>::operator->(in_RSI);
      pQVar2 = (QArrayDataPointer<QString> *)
               QArrayDataPointer<QString>::begin((QArrayDataPointer<QString> *)0x11949b);
      QArrayDataPointer<QString>::operator->(in_RSI);
      QArrayDataPointer<QString>::end(pQVar2);
      QtPrivate::QGenericArrayOps<QString>::moveAppend
                ((QGenericArrayOps<QString> *)in_RSI,(QString *)in_RDI,(QString *)pQVar2);
    }
  }
  return;
}

Assistant:

inline void QList<T>::append(QList<T> &&other)
{
    Q_ASSERT(&other != this);
    if (other.isEmpty())
        return;
    if (other.d->needsDetach() || !std::is_nothrow_move_constructible_v<T>)
        return append(other);

    // due to precondition &other != this, we can unconditionally modify 'this'
    d.detachAndGrow(QArrayData::GrowsAtEnd, other.size(), nullptr, nullptr);
    Q_ASSERT(d.freeSpaceAtEnd() >= other.size());
    d->moveAppend(other.d->begin(), other.d->end());
}